

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 65816Storage.cpp
# Opt level: O1

void __thiscall CPU::WDC65816::ProcessorStorage::set_m_x_flags(ProcessorStorage *this,bool m,bool x)

{
  RegisterPair16 *pRVar1;
  bool bVar2;
  ushort uVar3;
  
  uVar3 = -(ushort)!x | 0xff;
  (this->registers_).x_mask = uVar3;
  (this->registers_).x_shift = (uint)!x << 3;
  pRVar1 = &(this->registers_).x;
  pRVar1->full = pRVar1->full & uVar3;
  pRVar1 = &(this->registers_).y;
  pRVar1->full = pRVar1->full & uVar3;
  bVar2 = !m;
  (this->registers_).m_masks[0] = (ushort)bVar2 * 0x100 - 0x100;
  (this->registers_).m_masks[1] = -(ushort)bVar2 | 0xff;
  (this->registers_).m_shift = (uint)bVar2 << 3;
  (this->registers_).mx_flags[0] = m;
  (this->registers_).mx_flags[1] = x;
  return;
}

Assistant:

void ProcessorStorage::set_m_x_flags(bool m, bool x) {
	registers_.x_mask = x ? 0x00ff : 0xffff;
	registers_.x_shift = x ? 0 : 8;
	registers_.x.full &= registers_.x_mask;
	registers_.y.full &= registers_.x_mask;

	registers_.m_masks[0] = m ? 0xff00 : 0x0000;
	registers_.m_masks[1] = m ? 0x00ff : 0xffff;
	registers_.m_shift = m ? 0 : 8;

	// true/1 => 8bit for both flags.
	registers_.mx_flags[0] = m;
	registers_.mx_flags[1] = x;
}